

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

Int32 testing::internal::Int32FromEnvOrDie(char *var,Int32 default_val)

{
  bool bVar1;
  char *str;
  size_t sVar2;
  ostream *poVar3;
  Int32 result;
  Int32 local_2c;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  
  str = getenv(var);
  if (str != (char *)0x0) {
    Message::Message((Message *)&local_28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_28._M_head_impl + 0x10),"The value of environment variable ",0x22);
    poVar3 = (ostream *)(local_28._M_head_impl + 0x10);
    if (var == (char *)0x0) {
      var = "(null)";
      sVar2 = 6;
    }
    else {
      sVar2 = strlen(var);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,var,sVar2);
    bVar1 = ParseInt32((Message *)&local_28,str,&local_2c);
    if (local_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
    default_val = local_2c;
    if (!bVar1) {
      exit(1);
    }
  }
  return default_val;
}

Assistant:

Int32 Int32FromEnvOrDie(const char* var, Int32 default_val) {
  const char* str_val = posix::GetEnv(var);
  if (str_val == nullptr) {
    return default_val;
  }

  Int32 result;
  if (!ParseInt32(Message() << "The value of environment variable " << var,
                  str_val, &result)) {
    exit(EXIT_FAILURE);
  }
  return result;
}